

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O2

void bcf_enc_int1(kstring_t *s,int32_t x)

{
  int l;
  int32_t *p;
  int16_t z;
  int32_t z_1;
  
  if (x == -0x7fffffff) {
    bcf_enc_size(s,1,1);
    x = -0x7f;
  }
  else {
    if (0xfe < x + 0x7fU) {
      if (x + 0x7fffU < 0xffff) {
        p = (int32_t *)&z;
        l = 2;
        bcf_enc_size(s,1,2);
      }
      else {
        p = &z_1;
        bcf_enc_size(s,1,3);
        l = 4;
      }
      kputsn((char *)p,l,s);
      return;
    }
    bcf_enc_size(s,1,1);
  }
  kputc(x,s);
  return;
}

Assistant:

static inline void bcf_enc_int1(kstring_t *s, int32_t x)
{
    if (x == bcf_int32_vector_end) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_vector_end, s);
    } else if (x == bcf_int32_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(bcf_int8_missing, s);
    } else if (x <= INT8_MAX && x > bcf_int8_missing) {
        bcf_enc_size(s, 1, BCF_BT_INT8);
        kputc(x, s);
    } else if (x <= INT16_MAX && x > bcf_int16_missing) {
        int16_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT16);
        kputsn((char*)&z, 2, s);
    } else {
        int32_t z = x;
        bcf_enc_size(s, 1, BCF_BT_INT32);
        kputsn((char*)&z, 4, s);
    }
}